

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model_dict.hpp
# Opt level: O3

void __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
::BinaryQuadraticModel
          (BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
           *this,Linear<std::__cxx11::basic_string<char>,_double> *linear,
          Quadratic<std::__cxx11::basic_string<char>,_double> *quadratic,double *offset,
          Vartype vartype)

{
  _Hash_node_base *p_Var1;
  
  (this->m_linear)._M_h._M_buckets = &(this->m_linear)._M_h._M_single_bucket;
  (this->m_linear)._M_h._M_bucket_count = 1;
  (this->m_linear)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_linear)._M_h._M_element_count = 0;
  (this->m_linear)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_linear)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_linear)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_quadratic)._M_h._M_buckets = &(this->m_quadratic)._M_h._M_single_bucket;
  (this->m_quadratic)._M_h._M_bucket_count = 1;
  (this->m_quadratic)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_quadratic)._M_h._M_element_count = 0;
  (this->m_quadratic)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_quadratic)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_quadratic)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->m_offset = *offset;
  this->m_vartype = vartype;
  for (p_Var1 = (linear->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    add_variable(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var1 + 1),(double *)(p_Var1 + 5));
  }
  for (p_Var1 = (quadratic->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    add_interaction(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var1 + 1),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (p_Var1 + 5),(double *)(p_Var1 + 9));
  }
  return;
}

Assistant:

BinaryQuadraticModel(
        const Linear<IndexType, FloatType> &linear,
        const Quadratic<IndexType, FloatType> &quadratic,
        const FloatType &offset,
        const Vartype vartype ) :
        m_offset( offset ),
        m_vartype( vartype ) {
      add_variables_from( linear );
      add_interactions_from( quadratic );
    }